

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O2

optional<int> obj::read_index(char **ptr)

{
  char *pcVar1;
  ulong uVar2;
  _Optional_payload_base<int> _Var3;
  char *__nptr;
  char *local_20;
  
  local_20 = strip_spaces(*ptr);
  if (*local_20 == 0x2d || (int)*local_20 - 0x30U < 10) {
    uVar2 = strtol(local_20,&local_20,10);
    local_20 = strip_spaces(local_20);
    if (*local_20 == '/') {
      __nptr = local_20 + 1;
      pcVar1 = local_20 + 1;
      local_20 = __nptr;
      if (*pcVar1 != '/') {
        strtol(__nptr,&local_20,10);
      }
      local_20 = strip_spaces(local_20);
      if (*local_20 == '/') {
        local_20 = local_20 + 1;
        strtol(local_20,&local_20,10);
      }
    }
    *ptr = local_20;
    _Var3 = (_Optional_payload_base<int>)(uVar2 & 0xffffffff | 0x100000000);
  }
  else {
    _Var3._M_payload = (_Storage<int,_true>)0x0;
    _Var3._M_engaged = false;
    _Var3._5_3_ = 0;
  }
  return (optional<int>)_Var3;
}

Assistant:

inline std::optional<int> read_index(char** ptr) {
    char* base = *ptr;

    // Detect end of line (negative indices are supported) 
    base = strip_spaces(base);
    if (!std::isdigit(*base) && *base != '-')
        return std::nullopt;

    int index = std::strtol(base, &base, 10);
    base = strip_spaces(base);

    if (*base == '/') {
        base++;

        // Handle the case when there is no texture coordinate
        if (*base != '/')
            std::strtol(base, &base, 10);

        base = strip_spaces(base);

        if (*base == '/') {
            base++;
            std::strtol(base, &base, 10);
        }
    }

    *ptr = base;
    return std::make_optional(index);
}